

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

LogEst sqlite3LogEstAdd(LogEst a,LogEst b)

{
  short local_a;
  LogEst b_local;
  LogEst a_local;
  
  if (a < b) {
    local_a = b;
    if ((int)b <= a + 0x31) {
      if (a + 0x1f < (int)b) {
        local_a = b + 1;
      }
      else {
        local_a = b + (ushort)"\n\n\t\t\b\b\a\a\a\x06\x06\x06\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02"
                              [(int)b - (int)a];
      }
    }
  }
  else {
    local_a = a;
    if ((int)a <= b + 0x31) {
      if (b + 0x1f < (int)a) {
        local_a = a + 1;
      }
      else {
        local_a = a + (ushort)"\n\n\t\t\b\b\a\a\a\x06\x06\x06\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02"
                              [(int)a - (int)b];
      }
    }
  }
  return local_a;
}

Assistant:

SQLITE_PRIVATE LogEst sqlite3LogEstAdd(LogEst a, LogEst b){
  static const unsigned char x[] = {
     10, 10,                         /* 0,1 */
      9, 9,                          /* 2,3 */
      8, 8,                          /* 4,5 */
      7, 7, 7,                       /* 6,7,8 */
      6, 6, 6,                       /* 9,10,11 */
      5, 5, 5,                       /* 12-14 */
      4, 4, 4, 4,                    /* 15-18 */
      3, 3, 3, 3, 3, 3,              /* 19-24 */
      2, 2, 2, 2, 2, 2, 2,           /* 25-31 */
  };
  if( a>=b ){
    if( a>b+49 ) return a;
    if( a>b+31 ) return a+1;
    return a+x[a-b];
  }else{
    if( b>a+49 ) return b;
    if( b>a+31 ) return b+1;
    return b+x[b-a];
  }
}